

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChBuilderBeamEuler::BuildBeam
          (ChBuilderBeamEuler *this,shared_ptr<chrono::fea::ChMesh> *mesh,
          shared_ptr<chrono::fea::ChBeamSectionEuler> *sect,int N,
          shared_ptr<chrono::fea::ChNodeFEAxyzrot> *nodeA,ChVector<double> *B,ChVector<double> *Ydir
          )

{
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  *this_00;
  element_type *peVar1;
  ChMesh *pCVar2;
  pointer psVar3;
  long lVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  shared_ptr<chrono::fea::ChMesh> *psVar11;
  char cVar12;
  ChNodeFEAxyzrot *this_01;
  int iVar13;
  ChVector<double> *mv;
  long lVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  ChVector<double> v;
  ChMatrix33<double> mrot;
  ChVector<double> mZ;
  ChVector<double> mX;
  ChVector<double> mY;
  ChVector<double> local_268;
  element_type *local_250;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_248;
  undefined8 local_240;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_238;
  undefined8 local_230;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_228;
  shared_ptr<chrono::fea::ChElementBase> local_220;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_210;
  ChMatrix33<double> local_200;
  ChVector<double> local_1b8;
  long local_198;
  _func_int **local_190;
  double local_188;
  shared_ptr<chrono::fea::ChBeamSectionEuler> *local_180;
  ChBuilderBeamEuler *local_178;
  shared_ptr<chrono::fea::ChMesh> *local_170;
  ChVector<double> *local_168;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> *local_160;
  ChFrame<double> local_158;
  undefined1 local_c8 [16];
  ChVector<double> local_b8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double dStack_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double dStack_68;
  double dStack_60;
  double dStack_58;
  double dStack_50;
  double dStack_48;
  double dStack_40;
  double local_38;
  
  local_180 = sect;
  local_170 = mesh;
  std::
  vector<std::shared_ptr<chrono::fea::ChElementBeamEuler>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamEuler>_>_>
  ::clear(&this->beam_elems);
  this_00 = &this->beam_nodes;
  local_178 = this;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::clear(this_00);
  peVar1 = (nodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_268.m_data[0] = B->m_data[0] - *(double *)&(peVar1->super_ChNodeFEAbase).field_0x20;
  local_268.m_data[1] = B->m_data[1] - *(double *)&peVar1->field_0x28;
  local_268.m_data[2] = B->m_data[2] - *(double *)&peVar1->field_0x30;
  local_158.coord.pos.m_data[1] = 0.0;
  local_158._vptr_ChFrame = (_func_int **)0x0;
  local_158.coord.pos.m_data[0] = 0.0;
  local_b8.m_data[2] = 0.0;
  local_b8.m_data[0] = 0.0;
  local_b8.m_data[1] = 0.0;
  local_1b8.m_data[2] = 0.0;
  local_1b8.m_data[0] = 0.0;
  local_1b8.m_data[1] = 0.0;
  local_168 = B;
  ChVector<double>::DirToDxDyDz(&local_268,(ChVector<double> *)&local_158,&local_b8,&local_1b8,Ydir)
  ;
  local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_158._vptr_ChFrame;
  local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_b8.m_data[0];
  local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_1b8.m_data[0];
  local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_158.coord.pos.m_data[0];
  local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_b8.m_data[1];
  local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_1b8.m_data[1];
  local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_158.coord.pos.m_data[1];
  local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_b8.m_data[2];
  local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_1b8.m_data[2];
  local_160 = nodeA;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::push_back(this_00,nodeA);
  if (0 < N) {
    local_188 = (double)N;
    local_198 = (ulong)(uint)N << 4;
    iVar13 = 1;
    lVar14 = 0;
    local_190 = (_func_int **)&PTR__ChFrame_00b2b308;
    do {
      dVar15 = (double)iVar13 / local_188;
      peVar1 = (local_160->
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_1b8.m_data[0] = *(double *)&(peVar1->super_ChNodeFEAbase).field_0x20;
      local_1b8.m_data[0] =
           local_1b8.m_data[0] + dVar15 * (local_168->m_data[0] - local_1b8.m_data[0]);
      local_1b8.m_data[1] =
           *(double *)&peVar1->field_0x28 +
           dVar15 * (local_168->m_data[1] - *(double *)&peVar1->field_0x28);
      local_1b8.m_data[2] =
           *(double *)&peVar1->field_0x30 +
           dVar15 * (local_168->m_data[2] - *(double *)&peVar1->field_0x30);
      mv = &local_1b8;
      ChFrame<double>::ChFrame((ChFrame<double> *)&local_b8,mv,&local_200);
      this_01 = (ChNodeFEAxyzrot *)
                ChFrame<double>::operator_new((ChFrame<double> *)0x2c8,(size_t)mv);
      local_158._vptr_ChFrame = local_190;
      local_158.coord.pos.m_data[0] = local_b8.m_data[1];
      local_158.coord.pos.m_data[1] = local_b8.m_data[2];
      local_158.coord.pos.m_data[2] = dStack_a0;
      local_158.coord.rot.m_data[0] = local_98;
      local_158.coord.rot.m_data[1] = dStack_90;
      local_158.coord.rot.m_data[2] = dStack_88;
      local_158.coord.rot.m_data[3] = dStack_80;
      local_158.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           local_38;
      local_158.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
           local_78;
      local_158.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
           dStack_70;
      local_158.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           dStack_68;
      local_158.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           dStack_60;
      local_158.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
           dStack_58;
      local_158.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           dStack_50;
      local_158.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           dStack_48;
      local_158.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
           dStack_40;
      ChNodeFEAxyzrot::ChNodeFEAxyzrot(this_01,&local_158);
      local_268.m_data[0] = (double)this_01;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::fea::ChNodeFEAxyzrot*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_268.m_data + 1),this_01);
      psVar11 = local_170;
      pCVar2 = (local_170->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_210.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_268.m_data[0];
      local_210.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268.m_data[1];
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268.m_data[1] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)((long)local_268.m_data[1] + 8) =
               *(_Atomic_word *)((long)local_268.m_data[1] + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)((long)local_268.m_data[1] + 8) =
               *(_Atomic_word *)((long)local_268.m_data[1] + 8) + 1;
        }
      }
      ChMesh::AddNode(pCVar2,&local_210);
      if (local_210.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_210.
                   super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
      ::push_back(this_00,(value_type *)&local_268);
      local_158._vptr_ChFrame = (_func_int **)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::fea::ChElementBeamEuler,std::allocator<chrono::fea::ChElementBeamEuler>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_158.coord,
                 (ChElementBeamEuler **)&local_158,
                 (allocator<chrono::fea::ChElementBeamEuler> *)&local_b8);
      pCVar2 = (psVar11->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      local_220.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_158._vptr_ChFrame;
      local_220.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.coord.pos.m_data[0];
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.coord.pos.m_data[0] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)((long)local_158.coord.pos.m_data[0] + 8) =
               *(_Atomic_word *)((long)local_158.coord.pos.m_data[0] + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)((long)local_158.coord.pos.m_data[0] + 8) =
               *(_Atomic_word *)((long)local_158.coord.pos.m_data[0] + 8) + 1;
        }
      }
      ChMesh::AddElement(pCVar2,&local_220);
      if (local_220.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_220.
                   super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChElementBeamEuler>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamEuler>_>_>
      ::push_back(&local_178->beam_elems,(value_type *)&local_158);
      psVar3 = (this_00->
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_230 = *(undefined8 *)
                   ((long)&(psVar3->
                           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr + lVar14);
      local_228 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&(psVar3->
                           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                           )._M_refcount._M_pi + lVar14);
      if (local_228 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_228->_M_use_count = local_228->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_228->_M_use_count = local_228->_M_use_count + 1;
        }
      }
      psVar3 = (this_00->
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_240 = *(undefined8 *)
                   ((long)&psVar3[1].
                           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + lVar14);
      local_238 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                   ((long)&psVar3[1].
                           super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi + lVar14);
      if (local_238 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_238->_M_use_count = local_238->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_238->_M_use_count = local_238->_M_use_count + 1;
        }
      }
      (*(*(_func_int ***)local_158._vptr_ChFrame)[0x1a])
                (local_158._vptr_ChFrame,&local_230,&local_240);
      if (local_238 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_238);
      }
      if (local_228 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228);
      }
      dVar10 = local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [7];
      dVar9 = local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]
      ;
      dVar8 = local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5]
      ;
      dVar7 = local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]
      ;
      dVar39 = local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [2];
      dVar6 = local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
      ;
      dVar15 = local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0] + local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[4] +
               local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [8];
      if (0.0 <= dVar15) {
        dVar15 = dVar15 + 1.0;
        if (dVar15 < 0.0) {
          dVar15 = sqrt(dVar15);
        }
        else {
          auVar17._8_8_ = 0;
          auVar17._0_8_ = dVar15;
          auVar17 = vsqrtsd_avx(auVar17,auVar17);
          dVar15 = auVar17._0_8_;
        }
        dVar16 = dVar15 * 0.5;
        dVar15 = 0.5 / dVar15;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = (dVar10 - dVar8) * dVar15;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = (dVar39 - dVar9) * dVar15;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = (dVar7 - dVar6) * dVar15;
      }
      else {
        cVar12 = local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0] < local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[4];
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
        if ((bool)cVar12) {
          p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4];
        }
        if ((double)p_Var5 <
            local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8])
        {
          cVar12 = '\x02';
        }
        if (cVar12 == '\x02') {
          dVar15 = ((local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8] -
                    local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[0]) -
                   local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4]) + 1.0;
          if (dVar15 < 0.0) {
            dVar16 = sqrt(dVar15);
          }
          else {
            auVar19._8_8_ = 0;
            auVar19._0_8_ = dVar15;
            auVar17 = vsqrtsd_avx(auVar19,auVar19);
            dVar16 = auVar17._0_8_;
          }
          auVar37._8_8_ = 0;
          auVar37._0_8_ = dVar16 * 0.5;
          dVar16 = 0.5 / dVar16;
          auVar40._8_8_ = 0;
          auVar40._0_8_ = (dVar39 + dVar9) * dVar16;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = (dVar8 + dVar10) * dVar16;
          dVar39 = dVar7 - dVar6;
        }
        else if (cVar12 == '\x01') {
          dVar15 = ((local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[4] -
                    local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[8]) -
                   local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0]) + 1.0;
          if (dVar15 < 0.0) {
            dVar16 = sqrt(dVar15);
          }
          else {
            auVar18._8_8_ = 0;
            auVar18._0_8_ = dVar15;
            auVar17 = vsqrtsd_avx(auVar18,auVar18);
            dVar16 = auVar17._0_8_;
          }
          auVar38._8_8_ = 0;
          auVar38._0_8_ = dVar16 * 0.5;
          dVar16 = 0.5 / dVar16;
          auVar37._8_8_ = 0;
          auVar37._0_8_ = (dVar8 + dVar10) * dVar16;
          auVar40._8_8_ = 0;
          auVar40._0_8_ = (dVar6 + dVar7) * dVar16;
          dVar39 = dVar39 - dVar9;
        }
        else {
          dVar15 = ((local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[0] -
                    local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[4]) -
                   local_200.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[8]) + 1.0;
          if (dVar15 < 0.0) {
            dVar16 = sqrt(dVar15);
          }
          else {
            auVar20._8_8_ = 0;
            auVar20._0_8_ = dVar15;
            auVar17 = vsqrtsd_avx(auVar20,auVar20);
            dVar16 = auVar17._0_8_;
          }
          auVar40._8_8_ = 0;
          auVar40._0_8_ = dVar16 * 0.5;
          dVar16 = 0.5 / dVar16;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = (dVar6 + dVar7) * dVar16;
          auVar37._8_8_ = 0;
          auVar37._0_8_ = (dVar39 + dVar9) * dVar16;
          dVar39 = dVar10 - dVar8;
        }
        dVar16 = dVar39 * dVar16;
      }
      lVar4 = **(long **)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          ((long)local_158._vptr_ChFrame + 0xb0))->_M_use_count;
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (*(long **)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           ((long)local_158._vptr_ChFrame + 0xb0))->_M_use_count)[1];
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
      dVar39 = auVar40._0_8_;
      auVar45._0_8_ = -dVar39;
      auVar45._8_8_ = auVar40._8_8_ ^ 0x8000000000000000;
      auVar44._0_8_ = -auVar38._0_8_;
      auVar44._8_8_ = auVar38._8_8_ ^ 0x8000000000000000;
      auVar46._0_8_ = -auVar37._0_8_;
      auVar46._8_8_ = auVar37._8_8_ ^ 0x8000000000000000;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = *(ulong *)(lVar4 + 0x48);
      dVar15 = *(double *)(lVar4 + 0x38);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = dVar15;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = *(double *)(lVar4 + 0x40);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = *(ulong *)(lVar4 + 0x50);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = auVar46._0_8_ * dVar15;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = dVar16;
      auVar17 = vfmadd231sd_fma(auVar31,auVar42,auVar29);
      auVar17 = vfmadd231sd_fma(auVar17,auVar38,auVar25);
      auVar17 = vfmadd231sd_fma(auVar17,auVar45,auVar21);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = auVar44._0_8_ * dVar15;
      auVar19 = vfmadd231sd_fma(auVar33,auVar42,auVar21);
      auVar19 = vfmadd231sd_fma(auVar19,auVar46,auVar25);
      auVar19 = vfmadd231sd_fma(auVar19,auVar40,auVar29);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = auVar45._0_8_ * dVar15;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = dVar16;
      auVar20 = vfmadd231sd_fma(auVar35,auVar43,auVar25);
      auVar20 = vfmadd231sd_fma(auVar20,auVar37,auVar21);
      auVar20 = vfmadd231sd_fma(auVar20,auVar44,auVar29);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dVar39 * *(double *)(lVar4 + 0x40);
      auVar18 = vfmadd231sd_fma(auVar26,auVar43,auVar23);
      auVar18 = vfmadd231sd_fma(auVar18,auVar38,auVar21);
      auVar18 = vfmadd231sd_fma(auVar18,auVar37,auVar29);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_158._vptr_ChFrame + 0x110))->
      _vptr__Sp_counted_base = auVar18._0_8_;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_158._vptr_ChFrame + 0x110))->
      _M_use_count = (int)auVar20._0_8_;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_158._vptr_ChFrame + 0x110))->
      _M_weak_count = (int)((ulong)auVar20._0_8_ >> 0x20);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_158._vptr_ChFrame + 0x120))->
      _vptr__Sp_counted_base = auVar19._0_8_;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_158._vptr_ChFrame + 0x120))->
      _M_use_count = (int)auVar17._0_8_;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_158._vptr_ChFrame + 0x120))->
      _M_weak_count = (int)((ulong)auVar17._0_8_ >> 0x20);
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_c8 = auVar46;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        auVar46 = local_c8;
      }
      auVar41._8_8_ = 0;
      auVar41._0_8_ = dVar16;
      lVar4 = *(long *)(*(long *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                  ((long)local_158._vptr_ChFrame + 0xb0))->_M_use_count + 0x10);
      p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                (*(long *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           ((long)local_158._vptr_ChFrame + 0xb0))->_M_use_count + 0x18);
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
      auVar22._8_8_ = 0;
      auVar22._0_8_ = *(ulong *)(lVar4 + 0x48);
      dVar15 = *(double *)(lVar4 + 0x38);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar15;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(double *)(lVar4 + 0x40);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = *(ulong *)(lVar4 + 0x50);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = auVar46._0_8_ * dVar15;
      auVar17 = vfmadd231sd_fma(auVar32,auVar41,auVar30);
      auVar17 = vfmadd231sd_fma(auVar17,auVar38,auVar27);
      auVar17 = vfmadd231sd_fma(auVar17,auVar45,auVar22);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = auVar44._0_8_ * dVar15;
      auVar19 = vfmadd231sd_fma(auVar34,auVar41,auVar22);
      auVar19 = vfmadd231sd_fma(auVar19,auVar27,auVar46);
      auVar40 = vfmadd231sd_fma(auVar19,auVar40,auVar30);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = auVar45._0_8_ * dVar15;
      auVar19 = vfmadd231sd_fma(auVar36,auVar41,auVar27);
      auVar19 = vfmadd231sd_fma(auVar19,auVar37,auVar22);
      auVar19 = vfmadd231sd_fma(auVar19,auVar30,auVar44);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar39 * *(double *)(lVar4 + 0x40);
      auVar20 = vfmadd231sd_fma(auVar28,auVar41,auVar24);
      auVar38 = vfmadd231sd_fma(auVar20,auVar38,auVar22);
      auVar37 = vfmadd231sd_fma(auVar38,auVar37,auVar30);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_158._vptr_ChFrame + 0x130))->
      _vptr__Sp_counted_base = auVar37._0_8_;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_158._vptr_ChFrame + 0x130))->
      _M_use_count = (int)auVar19._0_8_;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_158._vptr_ChFrame + 0x130))->
      _M_weak_count = (int)((ulong)auVar19._0_8_ >> 0x20);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_158._vptr_ChFrame + 0x140))->
      _vptr__Sp_counted_base = auVar40._0_8_;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_158._vptr_ChFrame + 0x140))->
      _M_use_count = (int)auVar17._0_8_;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_158._vptr_ChFrame + 0x140))->
      _M_weak_count = (int)((ulong)auVar17._0_8_ >> 0x20);
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      local_250 = (local_180->
                  super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
      local_248._M_pi =
           (local_180->
           super___shared_ptr<chrono::fea::ChBeamSectionEuler,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_248._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_248._M_pi)->_M_use_count = (local_248._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_248._M_pi)->_M_use_count = (local_248._M_pi)->_M_use_count + 1;
        }
      }
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_158._vptr_ChFrame + 0xd0))->
      _vptr__Sp_counted_base = (_func_int **)local_250;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)local_158._vptr_ChFrame + 0xd0))->_M_use_count,&local_248);
      if (local_248._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_248._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.coord.pos.m_data[0] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158.coord.pos.m_data[0]);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268.m_data[1] !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268.m_data[1]);
      }
      iVar13 = iVar13 + 1;
      lVar14 = lVar14 + 0x10;
    } while (local_198 != lVar14);
  }
  return;
}

Assistant:

void ChBuilderBeamEuler::BuildBeam(std::shared_ptr<ChMesh> mesh,                 // mesh to store the resulting elements
                                   std::shared_ptr<ChBeamSectionEuler> sect,     // section material for beam elements
                                   const int N,                                  // number of elements in the segment
                                   std::shared_ptr<ChNodeFEAxyzrot> nodeA,       // starting point
                                   const ChVector<> B,                           // ending point
                                   const ChVector<> Ydir                         // the 'up' Y direction of the beam
) {
    beam_elems.clear();
    beam_nodes.clear();

    ChMatrix33<> mrot;
    mrot.Set_A_Xdir(B - nodeA->Frame().GetPos(), Ydir);

    beam_nodes.push_back(nodeA);

    for (int i = 1; i <= N; ++i) {
        double eta = (double)i / (double)N;
        ChVector<> pos = nodeA->Frame().GetPos() + (B - nodeA->Frame().GetPos()) * eta;

        auto nodeBi = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(pos, mrot));
        mesh->AddNode(nodeBi);
        beam_nodes.push_back(nodeBi);

        auto element = chrono_types::make_shared<ChElementBeamEuler>();
        mesh->AddElement(element);
        beam_elems.push_back(element);

        element->SetNodes(beam_nodes[i - 1], beam_nodes[i]);

        ChQuaternion<> elrot = mrot.Get_A_quaternion();
        element->SetNodeAreferenceRot(elrot.GetConjugate() % element->GetNodeA()->Frame().GetRot());
        element->SetNodeBreferenceRot(elrot.GetConjugate() % element->GetNodeB()->Frame().GetRot());
        // GetLog() << "Element n." << i << " with rotations: \n";
        // GetLog() << "   Qa=" << element->GetNodeAreferenceRot() << "\n";
        // GetLog() << "   Qb=" << element->GetNodeBreferenceRot() << "\n\n";
        element->SetSection(sect);
    }
}